

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O0

QDBusObjectPath * qdbus_cast<QDBusObjectPath>(QVariant *v)

{
  bool bVar1;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QMetaType *in_stack_ffffffffffffffb8;
  QVariant *arg;
  QVariant *v_00;
  QDBusArgument local_20;
  QMetaTypeInterface *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  arg = in_RDI;
  v_00 = in_RDI;
  local_10 = QVariant::metaType();
  local_18 = (QMetaTypeInterface *)QMetaType::fromType<QDBusArgument>();
  bVar1 = operator==((QMetaType *)in_RDI,in_stack_ffffffffffffffb8);
  if (bVar1) {
    qvariant_cast<QDBusArgument>(v_00);
    qdbus_cast<QDBusObjectPath>((QDBusArgument *)arg);
    QDBusArgument::~QDBusArgument(&local_20);
  }
  else {
    qvariant_cast<QDBusObjectPath>(v_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDBusObjectPath *)arg;
  }
  __stack_chk_fail();
}

Assistant:

inline T qdbus_cast(const QVariant &v)
{
    if (v.metaType() == QMetaType::fromType<QDBusArgument>())
        return qdbus_cast<T>(qvariant_cast<QDBusArgument>(v));
    else
        return qvariant_cast<T>(v);
}